

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::if2ip(int address_family,string *ifn)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  uint in_ESI;
  string *in_RDI;
  uint8_t s6_addr_head;
  char buf_1 [46];
  in6_addr *__a;
  sockaddr_in6 *sa_1;
  char buf [16];
  sockaddr_in *sa;
  ifaddrs *ifa;
  string addr_candidate;
  ifaddrs *ifap;
  char *in_stack_fffffffffffffed8;
  allocator *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator local_f2;
  undefined1 local_f1 [40];
  char local_c9;
  char local_c8 [55];
  undefined1 local_91;
  uint *local_90;
  long local_88;
  undefined4 local_80;
  allocator local_69;
  char local_68 [24];
  long local_50;
  undefined8 *local_48;
  string local_40 [32];
  undefined8 *local_20 [2];
  uint local_c;
  
  local_c = in_ESI;
  getifaddrs(local_20);
  std::__cxx11::string::string(local_40);
  local_48 = local_20[0];
  do {
    if (local_48 == (undefined8 *)0x0) {
      freeifaddrs(local_20[0]);
      std::__cxx11::string::string((string *)in_RDI,local_40);
LAB_001e46a2:
      local_80 = 1;
      std::__cxx11::string::~string(local_40);
      return in_RDI;
    }
    if (((local_48[3] != 0) &&
        (bVar2 = std::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8), bVar2)) &&
       ((local_c == 0 || (*(ushort *)local_48[3] == local_c)))) {
      if (*(short *)local_48[3] == 2) {
        local_50 = local_48[3];
        pcVar5 = inet_ntop(2,(void *)(local_50 + 4),local_68,0x10);
        if (pcVar5 != (char *)0x0) {
          freeifaddrs(local_20[0]);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)in_RDI,local_68,0x10,&local_69);
          std::allocator<char>::~allocator((allocator<char> *)&local_69);
          goto LAB_001e46a2;
        }
      }
      else if (*(short *)local_48[3] == 10) {
        local_88 = local_48[3];
        local_90 = (uint *)(local_88 + 8);
        uVar1 = *local_90;
        uVar3 = htonl(0xffc00000);
        uVar4 = htonl(0xfe800000);
        local_91 = (uVar1 & uVar3) == uVar4;
        if (!(bool)local_91) {
          memset(local_c8,0,0x2e);
          pcVar5 = inet_ntop(10,(void *)(local_88 + 8),local_c8,0x2e);
          if (pcVar5 != (char *)0x0) {
            local_c9 = *(char *)(local_88 + 8);
            if ((local_c9 != -4) && (local_c9 != -3)) {
              freeifaddrs(local_20[0]);
              paVar6 = &local_f2;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)in_RDI,local_c8,0x2e,paVar6);
              std::allocator<char>::~allocator((allocator<char> *)&local_f2);
              goto LAB_001e46a2;
            }
            in_stack_fffffffffffffee0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_f1 + 1),local_c8,0x2e,(allocator *)in_stack_fffffffffffffee0
                      );
            std::__cxx11::string::operator=(local_40,(string *)(local_f1 + 1));
            std::__cxx11::string::~string((string *)(local_f1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_f1);
          }
        }
      }
    }
    local_48 = (undefined8 *)*local_48;
  } while( true );
}

Assistant:

inline std::string if2ip(int address_family, const std::string& ifn) {
            struct ifaddrs* ifap;
            getifaddrs(&ifap);
            std::string addr_candidate;
            for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
                if (ifa->ifa_addr && ifn == ifa->ifa_name &&
                    (AF_UNSPEC == address_family ||
                        ifa->ifa_addr->sa_family == address_family)) {
                    if (ifa->ifa_addr->sa_family == AF_INET) {
                        auto sa = reinterpret_cast<struct sockaddr_in*>(ifa->ifa_addr);
                        char buf[INET_ADDRSTRLEN];
                        if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
                            freeifaddrs(ifap);
                            return std::string(buf, INET_ADDRSTRLEN);
                        }
                    } else if (ifa->ifa_addr->sa_family == AF_INET6) {
                        auto sa = reinterpret_cast<struct sockaddr_in6*>(ifa->ifa_addr);
                        if (!IN6_IS_ADDR_LINKLOCAL(&sa->sin6_addr)) {
                            char buf[INET6_ADDRSTRLEN] = {};
                            if (inet_ntop(AF_INET6, &sa->sin6_addr, buf, INET6_ADDRSTRLEN)) {
                                // equivalent to mac's IN6_IS_ADDR_UNIQUE_LOCAL
                                auto s6_addr_head = sa->sin6_addr.s6_addr[0];
                                if (s6_addr_head == 0xfc || s6_addr_head == 0xfd) {
                                    addr_candidate = std::string(buf, INET6_ADDRSTRLEN);
                                } else {
                                    freeifaddrs(ifap);
                                    return std::string(buf, INET6_ADDRSTRLEN);
                                }
                            }
                        }
                    }
                }
            }
            freeifaddrs(ifap);
            return addr_candidate;
        }